

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O0

int __thiscall stream::slice_reader::open(slice_reader *this,char *__file,int __oflag,...)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int extraout_EAX;
  ulong uVar5;
  ostream *poVar6;
  string *msg;
  ostringstream oss;
  path_type slice_file2;
  path_type slice_file;
  path_type *in_stack_00000460;
  slice_reader *in_stack_00000468;
  path *in_stack_fffffffffffffd28;
  ostream *in_stack_fffffffffffffd30;
  path *in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd59;
  undefined1 in_stack_fffffffffffffd5a;
  undefined1 in_stack_fffffffffffffd5b;
  undefined1 in_stack_fffffffffffffd5c;
  undefined1 in_stack_fffffffffffffd5d;
  undefined1 in_stack_fffffffffffffd5e;
  byte bVar7;
  undefined1 in_stack_fffffffffffffd5f;
  path *in_stack_fffffffffffffd88;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffd90;
  ostringstream local_268 [64];
  path_type *in_stack_fffffffffffffdd8;
  path_type *in_stack_fffffffffffffde0;
  slice_reader *in_stack_fffffffffffffde8;
  size_t in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  string local_50 [64];
  char *local_10;
  slice_reader *local_8;
  
  this->current_slice = (size_t)__file;
  this->is = (istream *)&this->ifs;
  local_10 = __file;
  local_8 = this;
  std::ifstream::close();
  slice_filename(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::_Construct<std::__cxx11::string,std::__cxx11::string_const&>
            ((path *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  std::__cxx11::string::~string(local_50);
  boost::filesystem::operator/
            ((path *)CONCAT17(in_stack_fffffffffffffd5f,
                              CONCAT16(in_stack_fffffffffffffd5e,
                                       CONCAT15(in_stack_fffffffffffffd5d,
                                                CONCAT14(in_stack_fffffffffffffd5c,
                                                         CONCAT13(in_stack_fffffffffffffd5b,
                                                                  CONCAT12(in_stack_fffffffffffffd5a
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffd59,
                                                  in_stack_fffffffffffffd58))))))),
             in_stack_fffffffffffffd50);
  bVar1 = open_file(in_stack_00000468,in_stack_00000460);
  std::_Destroy<std::__cxx11::string>((path *)0x1b61b3);
  if ((bVar1 & 1) == 0) {
    slice_filename(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::_Construct<std::__cxx11::string,std::__cxx11::string_const&>
              ((path *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
    uVar4 = std::__cxx11::string::empty();
    bVar3 = false;
    bVar7 = false;
    if ((uVar4 & 1) == 0) {
      bVar2 = boost::filesystem::operator!=
                        ((path *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      bVar7 = false;
      if (bVar2) {
        boost::filesystem::operator/
                  ((path *)CONCAT17(bVar1,(uint7)CONCAT15(bVar2,CONCAT14(in_stack_fffffffffffffd5c,
                                                                         CONCAT13(
                                                  in_stack_fffffffffffffd5b,
                                                  CONCAT12(in_stack_fffffffffffffd5a,
                                                           CONCAT11(in_stack_fffffffffffffd59,
                                                                    in_stack_fffffffffffffd58)))))),
                   in_stack_fffffffffffffd50);
        bVar3 = true;
        bVar7 = open_file(in_stack_00000468,in_stack_00000460);
      }
    }
    if (bVar3) {
      std::_Destroy<std::__cxx11::string>((path *)0x1b6337);
    }
    if ((((bVar7 & 1) == 0) &&
        (bVar3 = open_file_case_insensitive
                           (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                            in_stack_fffffffffffffdd8), !bVar3)) &&
       ((uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) != 0 ||
        ((bVar3 = boost::filesystem::operator!=
                            ((path *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28), !bVar3 ||
         (bVar3 = open_file_case_insensitive
                            (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                             in_stack_fffffffffffffdd8), !bVar3)))))) {
      std::__cxx11::ostringstream::ostringstream(local_268);
      poVar6 = std::operator<<((ostream *)local_268,"could not open slice ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(ulong)local_10);
      std::operator<<(poVar6,": ");
      boost::filesystem::operator<<(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      uVar5 = std::__cxx11::string::empty();
      if (((uVar5 & 1) == 0) &&
         (bVar3 = boost::filesystem::operator!=
                            ((path *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28), bVar3)) {
        in_stack_fffffffffffffd30 = std::operator<<((ostream *)local_268," or ");
        boost::filesystem::operator<<(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      }
      msg = (string *)__cxa_allocate_exception(0x20);
      std::__cxx11::ostringstream::str();
      slice_error::slice_error((slice_error *)in_stack_fffffffffffffd30,msg);
      __cxa_throw(msg,&slice_error::typeinfo,slice_error::~slice_error);
    }
    std::_Destroy<std::__cxx11::string>((path *)0x1b660b);
  }
  std::_Destroy<std::__cxx11::string>((path *)0x1b6629);
  return extraout_EAX;
}

Assistant:

void slice_reader::open(size_t slice) {
	
	current_slice = slice;
	is = &ifs;
	ifs.close();
	
	path_type slice_file = slice_filename(base_file, slice, slices_per_disk);
	if(open_file(dir / slice_file)) {
		return;
	}
	
	path_type slice_file2 = slice_filename(base_file2, slice, slices_per_disk);
	if(!base_file2.empty() && slice_file2 != slice_file && open_file(dir / slice_file2)) {
		return;
	}
	
	if(open_file_case_insensitive(dir, slice_file)) {
		return;
	}
	
	if(!base_file2.empty() && slice_file2 != slice_file && open_file_case_insensitive(dir, slice_file2)) {
		return;
	}
	
	std::ostringstream oss;
	oss << "could not open slice " << slice << ": " << slice_file;
	if(!base_file2.empty() && slice_file2 != slice_file) {
		oss << " or " << slice_file2;
	}
	throw slice_error(oss.str());
}